

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

int __thiscall
duckdb::WindowQuantileState<int>::WindowScalar<int,true>
          (WindowQuantileState<int> *this,CursorType *data,SubFrames *frames,idx_t n,Vector *result,
          QuantileValue *q)

{
  bool bVar1;
  pointer this_00;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  InternalException *this_01;
  long in_RDI;
  IndexError *idx_err;
  array<int,_2UL> dest;
  Interpolator<true> interp;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  Interpolator<true> *in_stack_fffffffffffffee0;
  QuantileValue *in_stack_fffffffffffffee8;
  allocator *paVar5;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar6;
  size_t in_stack_fffffffffffffef8;
  HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
  *in_stack_ffffffffffffff00;
  QuantileValue *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  idx_t in_stack_ffffffffffffff28;
  SubFrames *in_stack_ffffffffffffff30;
  QuantileCursor<int> *in_stack_ffffffffffffff38;
  QuantileSortTree *in_stack_ffffffffffffff40;
  allocator local_a1;
  string local_a0 [156];
  int local_4;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                      *)0xa15459);
  if (bVar1) {
    unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>::
    operator->((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
                *)in_stack_fffffffffffffee0);
    local_4 = QuantileSortTree::WindowScalar<int,int,true>
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                         (Vector *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff18);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>_>
                        *)0xa154b3);
    if (!bVar1) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar5 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"No accelerator for scalar QUANTILE",paVar5);
      duckdb::InternalException::InternalException(this_01,local_a0);
      __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
    }
    this_00 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
              ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
                            *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::size
              (this_00);
    Interpolator<true>::Interpolator
              ((Interpolator<true> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,(idx_t)in_stack_fffffffffffffee0,
               (bool)in_stack_fffffffffffffedf);
    unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
    ::operator->((unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>_>,_true>
                  *)in_stack_fffffffffffffee0);
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::at
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                *)in_stack_fffffffffffffee8);
    pvVar2 = vector<std::pair<unsigned_long,_int>,_true>::operator[]
                       ((vector<std::pair<unsigned_long,_int>,_true> *)in_stack_fffffffffffffee0,
                        CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    iVar6 = pvVar2->second;
    pvVar3 = std::array<int,_2UL>::operator[]
                       ((array<int,_2UL> *)in_stack_fffffffffffffee0,
                        CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    *pvVar3 = iVar6;
    sVar4 = std::
            vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
            size((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                  *)(in_RDI + 0x28));
    if (sVar4 < 2) {
      pvVar2 = vector<std::pair<unsigned_long,_int>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_int>,_true> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      iVar6 = pvVar2->second;
      pvVar3 = std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      *pvVar3 = iVar6;
    }
    else {
      pvVar2 = vector<std::pair<unsigned_long,_int>,_true>::operator[]
                         ((vector<std::pair<unsigned_long,_int>,_true> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      iVar6 = pvVar2->second;
      pvVar3 = std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)in_stack_fffffffffffffee0,
                          CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      *pvVar3 = iVar6;
    }
    std::array<int,_2UL>::data((array<int,_2UL> *)0xa156b5);
    local_4 = Interpolator<true>::Extract<int,int>
                        (in_stack_fffffffffffffee0,
                         (int *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                         (Vector *)0xa156cd);
  }
  return local_4;
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}